

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::CellConfigRuleSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,CellConfigRuleSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  ConfigCellIdentifierSyntax *node;
  SyntaxNode *node_00;
  size_t index_local;
  CellConfigRuleSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->cell).kind;
    token._2_1_ = (this->cell).field_0x2;
    token.numFlags.raw = (this->cell).numFlags.raw;
    token.rawLen = (this->cell).rawLen;
    token.info = (this->cell).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    node = not_null<slang::syntax::ConfigCellIdentifierSyntax_*>::get(&this->name);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
    break;
  case 2:
    node_00 = &not_null<slang::syntax::ConfigRuleClauseSyntax_*>::get(&this->ruleClause)->
               super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node_00);
    break;
  case 3:
    token_00.kind = (this->semi).kind;
    token_00._2_1_ = (this->semi).field_0x2;
    token_00.numFlags.raw = (this->semi).numFlags.raw;
    token_00.rawLen = (this->semi).rawLen;
    token_00.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax CellConfigRuleSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return cell;
        case 1: return name.get();
        case 2: return ruleClause.get();
        case 3: return semi;
        default: return nullptr;
    }
}